

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWaveBank_Play(FACTWaveBank *pWaveBank,uint16_t nWaveIndex,uint32_t dwFlags,
                          uint32_t dwPlayOffset,uint8_t nLoopCount,FACTWave **ppWave)

{
  long in_RDI;
  FACTWave *in_R9;
  FACTWave **in_stack_00000090;
  uint8_t in_stack_0000009b;
  uint32_t in_stack_0000009c;
  uint32_t in_stack_000000a0;
  uint16_t in_stack_000000a6;
  FACTWaveBank *in_stack_000000a8;
  uint local_4;
  
  if (in_RDI != 0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x115f92);
    FACTWaveBank_Prepare
              (in_stack_000000a8,in_stack_000000a6,in_stack_000000a0,in_stack_0000009c,
               in_stack_0000009b,in_stack_00000090);
    FACTWave_Play(in_R9);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x115fd8);
  }
  else {
    in_R9->parentBank = (FACTWaveBank *)0x0;
  }
  local_4 = (uint)(in_RDI == 0);
  return local_4;
}

Assistant:

uint32_t FACTWaveBank_Play(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	uint32_t dwFlags,
	uint32_t dwPlayOffset,
	uint8_t nLoopCount,
	FACTWave **ppWave
) {
	if (pWaveBank == NULL)
	{
		*ppWave = NULL;
		return 1;
	}
	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	FACTWaveBank_Prepare(
		pWaveBank,
		nWaveIndex,
		dwFlags,
		dwPlayOffset,
		nLoopCount,
		ppWave
	);
	FACTWave_Play(*ppWave);
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}